

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O2

Status * __thiscall
draco::PlyDecoder::DecodeInternal(Status *__return_storage_ptr__,PlyDecoder *this)

{
  string *this_00;
  Mesh *pMVar1;
  int iVar2;
  PlyElement *pPVar3;
  Status *_local_status;
  allocator<char> local_89;
  string local_88;
  PlyReader ply_reader;
  
  PlyReader::PlyReader(&ply_reader);
  PlyReader::Read(__return_storage_ptr__,&ply_reader,&this->buffer_);
  if (__return_storage_ptr__->code_ == OK) {
    this_00 = &__return_storage_ptr__->error_msg_;
    std::__cxx11::string::~string((string *)this_00);
    if (this->out_mesh_ != (Mesh *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"face",&local_89);
      pPVar3 = PlyReader::GetElementByName(&ply_reader,&local_88);
      DecodeFaceData(__return_storage_ptr__,this,pPVar3);
      std::__cxx11::string::~string((string *)&local_88);
      if (__return_storage_ptr__->code_ != OK) goto LAB_00111708;
      std::__cxx11::string::~string((string *)this_00);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"vertex",&local_89);
    pPVar3 = PlyReader::GetElementByName(&ply_reader,&local_88);
    DecodeVertexData(__return_storage_ptr__,this,pPVar3);
    std::__cxx11::string::~string((string *)&local_88);
    if (__return_storage_ptr__->code_ == OK) {
      std::__cxx11::string::~string((string *)this_00);
      pMVar1 = this->out_mesh_;
      if (pMVar1 != (Mesh *)0x0) {
        if ((int)(((long)(pMVar1->faces_).vector_.
                         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pMVar1->faces_).vector_.
                        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc) != 0) {
          iVar2 = (*this->out_point_cloud_->_vptr_PointCloud[4])();
          if ((char)iVar2 == '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_88,"Could not deduplicate attribute values",&local_89);
            __return_storage_ptr__->code_ = DRACO_ERROR;
            std::__cxx11::string::string((string *)this_00,(string *)&local_88);
            std::__cxx11::string::~string((string *)&local_88);
            goto LAB_00111708;
          }
          (*this->out_point_cloud_->_vptr_PointCloud[5])();
        }
      }
      __return_storage_ptr__->code_ = OK;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      (__return_storage_ptr__->error_msg_)._M_string_length = 0;
      (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    }
  }
LAB_00111708:
  PlyReader::~PlyReader(&ply_reader);
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeInternal() {
  PlyReader ply_reader;
  DRACO_RETURN_IF_ERROR(ply_reader.Read(buffer()));
  // First, decode the connectivity data.
  if (out_mesh_)
    DRACO_RETURN_IF_ERROR(DecodeFaceData(ply_reader.GetElementByName("face")));
  // Decode all attributes.
  DRACO_RETURN_IF_ERROR(
      DecodeVertexData(ply_reader.GetElementByName("vertex")));
  // In case there are no faces this is just a point cloud which does
  // not require deduplication.
  if (out_mesh_ && out_mesh_->num_faces() != 0) {
#ifdef DRACO_ATTRIBUTE_VALUES_DEDUPLICATION_SUPPORTED
    if (!out_point_cloud_->DeduplicateAttributeValues()) {
      return Status(Status::DRACO_ERROR,
                    "Could not deduplicate attribute values");
    }
#endif
#ifdef DRACO_ATTRIBUTE_INDICES_DEDUPLICATION_SUPPORTED
    out_point_cloud_->DeduplicatePointIds();
#endif
  }
  return OkStatus();
}